

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_readfile.cc
# Opt level: O1

int main(int argc,char **argv)

{
  ostream *poVar1;
  timeval end;
  timeval begin;
  timeval local_38;
  timeval local_28;
  
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  readfile(argv[1]);
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"read time used:",0xf);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,
                      (int)((float)(local_38.tv_sec - local_28.tv_sec) * 1000.0 +
                           (float)(local_38.tv_usec - local_28.tv_usec) / 1000.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ms",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

  struct timeval begin, end;
  gettimeofday(&begin, NULL);
  readfile(argv[1]);
  gettimeofday(&end, NULL);
  std::cout<<"read time used:"<<int(get_elapse_time(&begin, &end))<<" ms"<<std::endl;
}